

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseAction(WastParser *this,ActionPtr *out_action)

{
  Result RVar1;
  TokenType TVar2;
  Action *pAVar3;
  long lVar4;
  Action *pAVar5;
  long *plVar6;
  Location loc;
  Location local_138;
  undefined1 local_118 [32];
  long *local_f8 [2];
  long local_e8 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  Var local_c0;
  Var local_78;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_118,this);
  local_138.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_118._16_8_;
  local_138.field_1._8_8_ = local_118._24_8_;
  local_138.filename._M_len = local_118._0_8_;
  local_138.filename._M_str = (char *)local_118._8_8_;
  TVar2 = Peek(this,0);
  if (TVar2 == Get) {
    Consume((Token *)local_118,this);
    pAVar3 = (Action *)operator_new(0x98);
    pAVar3->_vptr_Action = (_func_int **)&PTR__Action_0019b508;
    (pAVar3->loc).filename._M_len = local_138.filename._M_len;
    (pAVar3->loc).filename._M_str = local_138.filename._M_str;
    (pAVar3->loc).field_1.field_1.offset = (size_t)local_138.field_1.field_1.offset;
    *(undefined8 *)((long)&(pAVar3->loc).field_1 + 8) = local_138.field_1._8_8_;
    Var::Var(&pAVar3->module_var);
    (pAVar3->name)._M_dataplus._M_p = (pointer)&(pAVar3->name).field_2;
    (pAVar3->name)._M_string_length = 0;
    (pAVar3->name).field_2._M_local_buf[0] = '\0';
    pAVar3->type_ = Get;
    pAVar3->_vptr_Action = (_func_int **)&PTR__Action_0019b528;
    Var::Var(&local_c0,this->last_module_index_,&local_138);
    ParseVarOpt(this,&pAVar3->module_var,&local_c0);
    Var::~Var(&local_c0);
    RVar1 = ParseQuotedText(this,&pAVar3->name,true);
    if (RVar1.enum_ != Error) {
      pAVar5 = (out_action->_M_t).
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
      super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = pAVar3;
      goto LAB_0013f378;
    }
  }
  else {
    if (TVar2 != Invoke) {
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"invoke","");
      plVar6 = local_e8;
      local_f8[0] = plVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"get","");
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 (string *)local_118,&local_d8);
      RVar1 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_d8,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      lVar4 = -0x40;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      return (Result)RVar1.enum_;
    }
    Consume((Token *)local_118,this);
    pAVar3 = (Action *)operator_new(0xb0);
    pAVar3->_vptr_Action = (_func_int **)&PTR__Action_0019b508;
    (pAVar3->loc).filename._M_len = local_138.filename._M_len;
    (pAVar3->loc).filename._M_str = local_138.filename._M_str;
    (pAVar3->loc).field_1.field_1.offset = (size_t)local_138.field_1.field_1.offset;
    *(undefined8 *)((long)&(pAVar3->loc).field_1 + 8) = local_138.field_1._8_8_;
    Var::Var(&pAVar3->module_var);
    (pAVar3->name)._M_dataplus._M_p = (pointer)&(pAVar3->name).field_2;
    (pAVar3->name)._M_string_length = 0;
    (pAVar3->name).field_2._M_local_buf[0] = '\0';
    pAVar3->type_ = Invoke;
    pAVar3->_vptr_Action = (_func_int **)&PTR__InvokeAction_0019b4a8;
    pAVar3[1]._vptr_Action = (_func_int **)0x0;
    pAVar3[1].loc.filename._M_len = 0;
    pAVar3[1].loc.filename._M_str = (char *)0x0;
    Var::Var(&local_78,this->last_module_index_,&local_138);
    ParseVarOpt(this,&pAVar3->module_var,&local_78);
    Var::~Var(&local_78);
    RVar1 = ParseQuotedText(this,&pAVar3->name,true);
    if ((RVar1.enum_ != Error) &&
       (RVar1 = ParseConstList(this,(ConstVector *)(pAVar3 + 1),Normal), RVar1.enum_ != Error)) {
      pAVar5 = (out_action->_M_t).
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
      super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = pAVar3;
LAB_0013f378:
      if (pAVar5 != (Action *)0x0) {
        (*pAVar5->_vptr_Action[1])();
      }
      RVar1 = Expect(this,Rpar);
      return (Result)(uint)(RVar1.enum_ == Error);
    }
  }
  (*pAVar3->_vptr_Action[1])(pAVar3);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseAction(ActionPtr* out_action) {
  WABT_TRACE(ParseAction);
  EXPECT(Lpar);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Invoke: {
      Consume();
      auto action = std::make_unique<InvokeAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      CHECK_RESULT(ParseConstList(&action->args, ConstType::Normal));
      *out_action = std::move(action);
      break;
    }

    case TokenType::Get: {
      Consume();
      auto action = std::make_unique<GetAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      *out_action = std::move(action);
      break;
    }

    default:
      return ErrorExpected({"invoke", "get"});
  }
  EXPECT(Rpar);
  return Result::Ok;
}